

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O1

SecretMatch __thiscall
duckdb::SecretStorage::SelectBestMatch
          (SecretStorage *this,SecretEntry *secret_entry,string *path,int64_t offset,
          SecretMatch *current_best)

{
  int iVar1;
  pointer pBVar2;
  undefined4 extraout_var;
  pointer pSVar3;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t iVar4;
  long score;
  SecretMatch SVar5;
  
  pBVar2 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
           ::operator->(&secret_entry->secret);
  iVar1 = (*pBVar2->_vptr_BaseSecret[2])(pBVar2,path);
  score = CONCAT44(extraout_var,iVar1) * 100 - offset;
  if (current_best->score < score) {
LAB_01652a1e:
    SecretMatch::SecretMatch((SecretMatch *)this,secret_entry,score);
    iVar4 = extraout_RDX_00;
  }
  else {
    if (score == current_best->score) {
      pBVar2 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator->(&secret_entry->secret);
      pSVar3 = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
               operator->(&current_best->secret_entry);
      unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>::
      operator*(&pSVar3->secret);
      iVar1 = ::std::__cxx11::string::compare((string *)&pBVar2->name);
      if (iVar1 < 0) goto LAB_01652a1e;
    }
    SecretMatch::SecretMatch((SecretMatch *)this,current_best);
    iVar4 = extraout_RDX;
  }
  SVar5.score = iVar4;
  SVar5.secret_entry.
  super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
  super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
       (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)this;
  return SVar5;
}

Assistant:

SecretMatch SecretStorage::SelectBestMatch(SecretEntry &secret_entry, const string &path, int64_t offset,
                                           SecretMatch &current_best) {
	// Get secret match score
	auto match_score = secret_entry.secret->MatchScore(path);

	// On no match
	if (match_score == NumericLimits<int64_t>::Minimum()) {
		return current_best;
	}

	// The number of characters that match, where 0 means matching the catchall of "*"
	D_ASSERT(match_score >= 0);

	// Apply storage tie-break offset
	match_score = 100 * match_score - offset;

	// Choose the best matching score, tie-breaking on secret name when necessary
	if (match_score > current_best.score) {
		return SecretMatch(secret_entry, match_score);
	} else if (match_score == current_best.score &&
	           secret_entry.secret->GetName() < current_best.GetSecret().GetName()) {
		return SecretMatch(secret_entry, match_score);
	} else {
		return current_best;
	}
}